

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O0

Kit_DsdObj_t * Kit_DsdNtkRoot(Kit_DsdNtk_t *pNtk)

{
  int Id;
  Kit_DsdObj_t *pKVar1;
  Kit_DsdNtk_t *pNtk_local;
  
  Id = Abc_Lit2Var((uint)pNtk->Root);
  pKVar1 = Kit_DsdNtkObj(pNtk,Id);
  return pKVar1;
}

Assistant:

static inline Kit_DsdObj_t *  Kit_DsdNtkRoot( Kit_DsdNtk_t * pNtk )             { return Kit_DsdNtkObj( pNtk, Abc_Lit2Var(pNtk->Root) );                      }